

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O3

void __thiscall
icu_63::RuleBasedNumberFormat::parse
          (RuleBasedNumberFormat *this,UnicodeString *text,Formattable *result,
          ParsePosition *parsePosition)

{
  double number;
  int iVar1;
  Formattable *this_00;
  UBool UVar2;
  undefined4 uVar3;
  Type TVar4;
  int iVar5;
  NFRuleSet *this_01;
  NFRuleSet **ppNVar6;
  double dVar7;
  ParsePosition high_pp;
  ParsePosition working_pp;
  ParsePosition workingPos;
  UnicodeString workingText;
  Formattable high_result;
  Formattable working_result;
  ParsePosition local_188;
  ParsePosition local_178;
  Formattable *local_168;
  ParsePosition local_160;
  UnicodeString local_150;
  Formattable local_110;
  Formattable local_a0;
  
  if (this->fRuleSets == (NFRuleSet **)0x0) {
    parsePosition->errorIndex = 0;
  }
  else {
    local_168 = result;
    UnicodeString::UnicodeString(&local_150,text,parsePosition->index);
    local_160.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003b53a0;
    local_160.index = 0;
    local_160.errorIndex = -1;
    local_188.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003b53a0;
    local_188.index = 0;
    local_188.errorIndex = -1;
    Formattable::Formattable(&local_110);
    ppNVar6 = this->fRuleSets;
    this_01 = *ppNVar6;
    if (this_01 != (NFRuleSet *)0x0) {
      do {
        ppNVar6 = ppNVar6 + 1;
        if ((this_01->fIsPublic != '\0') && (this_01->fIsParseable != '\0')) {
          local_178.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003b53a0;
          local_178.index = 0;
          local_178.errorIndex = -1;
          Formattable::Formattable(&local_a0);
          NFRuleSet::parse(this_01,&local_150,&local_178,17592186044416.0,0,&local_a0);
          if (local_188.index < local_178.index) {
            local_188.index = local_178.index;
            local_188.errorIndex = local_178.errorIndex;
            Formattable::operator=(&local_110,&local_a0);
            uVar3 = local_150.fUnion.fFields.fLength;
            if (-1 < local_150.fUnion.fStackFields.fLengthAndFlags) {
              uVar3 = (int)local_150.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            if (local_188.index == uVar3) {
              Formattable::~Formattable(&local_a0);
              ParsePosition::~ParsePosition(&local_178);
              break;
            }
          }
          Formattable::~Formattable(&local_a0);
          ParsePosition::~ParsePosition(&local_178);
        }
        this_01 = *ppNVar6;
      } while (this_01 != (NFRuleSet *)0x0);
    }
    this_00 = local_168;
    iVar1 = parsePosition->index;
    parsePosition->index = local_188.index + iVar1;
    iVar5 = -1;
    if (local_188.index < 1) {
      iVar5 = 0;
      if (0 < local_188.errorIndex) {
        iVar5 = local_188.errorIndex;
      }
      iVar5 = iVar5 + iVar1;
    }
    parsePosition->errorIndex = iVar5;
    Formattable::operator=(local_168,&local_110);
    TVar4 = Formattable::getType(this_00);
    if (TVar4 == kDouble) {
      number = (this_00->fValue).fDouble;
      UVar2 = uprv_isNaN_63(number);
      if (((UVar2 == '\0') && (dVar7 = uprv_trunc_63(number), number <= 2147483647.0)) &&
         (-2147483648.0 <= number)) {
        if ((number == dVar7) && (!NAN(number) && !NAN(dVar7))) {
          Formattable::setLong(this_00,(int)number);
        }
      }
    }
    Formattable::~Formattable(&local_110);
    ParsePosition::~ParsePosition(&local_188);
    ParsePosition::~ParsePosition(&local_160);
    UnicodeString::~UnicodeString(&local_150);
  }
  return;
}

Assistant:

void
RuleBasedNumberFormat::parse(const UnicodeString& text,
                             Formattable& result,
                             ParsePosition& parsePosition) const
{
    if (!fRuleSets) {
        parsePosition.setErrorIndex(0);
        return;
    }

    UnicodeString workingText(text, parsePosition.getIndex());
    ParsePosition workingPos(0);

    ParsePosition high_pp(0);
    Formattable high_result;

    for (NFRuleSet** p = fRuleSets; *p; ++p) {
        NFRuleSet *rp = *p;
        if (rp->isPublic() && rp->isParseable()) {
            ParsePosition working_pp(0);
            Formattable working_result;

            rp->parse(workingText, working_pp, kMaxDouble, 0, working_result);
            if (working_pp.getIndex() > high_pp.getIndex()) {
                high_pp = working_pp;
                high_result = working_result;

                if (high_pp.getIndex() == workingText.length()) {
                    break;
                }
            }
        }
    }

    int32_t startIndex = parsePosition.getIndex();
    parsePosition.setIndex(startIndex + high_pp.getIndex());
    if (high_pp.getIndex() > 0) {
        parsePosition.setErrorIndex(-1);
    } else {
        int32_t errorIndex = (high_pp.getErrorIndex()>0)? high_pp.getErrorIndex(): 0;
        parsePosition.setErrorIndex(startIndex + errorIndex);
    }
    result = high_result;
    if (result.getType() == Formattable::kDouble) {
        double d = result.getDouble();
        if (!uprv_isNaN(d) && d == uprv_trunc(d) && INT32_MIN <= d && d <= INT32_MAX) {
            // Note: casting a double to an int when the double is too large or small
            //       to fit the destination is undefined behavior. The explicit range checks,
            //       above, are required. Just casting and checking the result value is undefined.
            result.setLong(static_cast<int32_t>(d));
        }
    }
}